

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void run(string *rootDir,string *containerId,string *distroName,string *command,
        ResourceLimits *resourceLimits,bool buildImage)

{
  bool bVar1;
  ostream *poVar2;
  Container *container;
  
  bVar1 = imageExists(rootDir,containerId);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Running image ",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(containerId->_M_dataplus)._M_p,
                        containerId->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  container = createContainer(distroName,containerId,rootDir,command,resourceLimits,buildImage,bVar1
                             );
  bVar1 = setUpContainer(container);
  if (bVar1) {
    startContainer(container);
  }
  cleanUpContainer(container);
  return;
}

Assistant:

void run(std::string rootDir,
         std::string containerId,
         std::string distroName,
         std::string command,
         ResourceLimits* resourceLimits,
         bool buildImage)
{
    bool isImage = imageExists(rootDir, containerId);

    if (isImage)
        std::cout << "Running image " << containerId << std::endl;

    Container* container = createContainer(distroName, containerId, rootDir,
                                           command, resourceLimits, buildImage, isImage);
    if (setUpContainer(container))
    {
        startContainer(container);
    }
    cleanUpContainer(container);
}